

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O1

int envy_bios_parse_power_sense(envy_bios *bios)

{
  ulong uVar1;
  uint8_t uVar2;
  byte bVar3;
  uint32_t uVar4;
  int iVar5;
  envy_bios_power_sense_entry *peVar6;
  uint8_t *puVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  
  uVar8 = (bios->power).sense.offset;
  iVar12 = -0x16;
  if ((ulong)uVar8 != 0) {
    if (uVar8 < bios->length) {
      (bios->power).sense.version = bios->data[uVar8];
    }
    else {
      (bios->power).sense.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    uVar2 = (bios->power).sense.version;
    if ((uVar2 == ' ') || (uVar2 == '\x10')) {
      uVar8 = (bios->power).sense.offset + 1;
      if (uVar8 < bios->length) {
        (bios->power).sense.hlen = bios->data[uVar8];
        iVar12 = 0;
      }
      else {
        (bios->power).sense.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar12 = -0xe;
      }
      uVar8 = (bios->power).sense.offset + 2;
      if (uVar8 < bios->length) {
        (bios->power).sense.rlen = bios->data[uVar8];
        iVar9 = 0;
      }
      else {
        (bios->power).sense.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar9 = -0xe;
      }
      uVar8 = (bios->power).sense.offset + 3;
      if (uVar8 < bios->length) {
        (bios->power).sense.entriesnum = bios->data[uVar8];
        iVar5 = 0;
      }
      else {
        (bios->power).sense.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar5 = -0xe;
      }
      (bios->power).sense.valid = (iVar9 == 0 && iVar12 == 0) && iVar5 == 0;
      bVar3 = (bios->power).sense.entriesnum;
      peVar6 = (envy_bios_power_sense_entry *)malloc((ulong)((uint)bVar3 * 8) * 3);
      (bios->power).sense.entries = peVar6;
      if (bVar3 != 0) {
        lVar11 = 6;
        uVar10 = 0;
        do {
          uVar4 = (bios->power).sense.offset;
          bVar3 = (bios->power).sense.hlen;
          iVar12 = (uint)(bios->power).sense.rlen * (int)uVar10;
          uVar8 = uVar4 + bVar3 + iVar12;
          peVar6 = (bios->power).sense.entries;
          peVar6[uVar10].offset = uVar8;
          uVar2 = (bios->power).sense.version;
          if (uVar2 == ' ') {
            if (uVar8 < bios->length) {
              peVar6[uVar10].mode = bios->data[uVar8];
            }
            else {
              peVar6[uVar10].mode = '\0';
              fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar8);
            }
            uVar8 = uVar8 + 1;
            puVar7 = &(bios->power).sense.entries[uVar10].extdev_id;
            if (uVar8 < bios->length) {
              *puVar7 = bios->data[uVar8];
            }
            else {
              *puVar7 = '\0';
              fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar8);
            }
            if (0x15 < (bios->power).sense.rlen) {
              envy_bios_parse_power_sense_cold_1();
            }
            if (5 < (bios->power).sense.rlen) {
              uVar13 = 0;
              do {
                uVar1 = ((uint)bVar3 + uVar4 + iVar12 + 5) + uVar13;
                peVar6 = (bios->power).sense.entries;
                if ((uint)uVar1 < bios->length) {
                  *(uint8_t *)((long)&peVar6->offset + uVar13 + lVar11) =
                       bios->data[uVar1 & 0xffffffff];
                }
                else {
                  *(undefined1 *)((long)&peVar6->offset + uVar13 + lVar11) = 0;
                  fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                }
              } while ((uVar13 < 0xf) &&
                      (uVar13 = uVar13 + 1,
                      (long)uVar13 < (long)((ulong)(bios->power).sense.rlen - 5)));
            }
          }
          else if (uVar2 == '\x10') {
            if (uVar8 + 1 < bios->length) {
              peVar6[uVar10].mode = bios->data[uVar8 + 1];
            }
            else {
              peVar6[uVar10].mode = '\0';
              fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
            }
            uVar8 = uVar8 + 2;
            puVar7 = &(bios->power).sense.entries[uVar10].extdev_id;
            if (uVar8 < bios->length) {
              *puVar7 = bios->data[uVar8];
            }
            else {
              *puVar7 = '\0';
              fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar8);
            }
            if (0x13 < (bios->power).sense.rlen) {
              envy_bios_parse_power_sense_cold_2();
            }
            if (3 < (bios->power).sense.rlen) {
              uVar13 = 0;
              do {
                uVar1 = ((uint)bVar3 + uVar4 + iVar12 + 3) + uVar13;
                peVar6 = (bios->power).sense.entries;
                if ((uint)uVar1 < bios->length) {
                  *(uint8_t *)((long)&peVar6->offset + uVar13 + lVar11) =
                       bios->data[uVar1 & 0xffffffff];
                }
                else {
                  *(undefined1 *)((long)&peVar6->offset + uVar13 + lVar11) = 0;
                  fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                }
              } while ((uVar13 < 0xf) &&
                      (uVar13 = uVar13 + 1,
                      (long)uVar13 < (long)((ulong)(bios->power).sense.rlen - 3)));
            }
          }
          uVar10 = uVar10 + 1;
          lVar11 = lVar11 + 0x18;
        } while (uVar10 < (bios->power).sense.entriesnum);
      }
      iVar12 = 0;
    }
    else {
      fprintf(_stderr,"Unknown SENSE table version 0x%x\n");
    }
  }
  return iVar12;
}

Assistant:

int envy_bios_parse_power_sense(struct envy_bios *bios) {
	struct envy_bios_power_sense *sense = &bios->power.sense;
	int i, err = 0;

	if (!sense->offset)
		return -EINVAL;

	bios_u8(bios, sense->offset + 0x0, &sense->version);
	switch(sense->version) {
	case 0x10:
	case 0x20:
		err |= bios_u8(bios, sense->offset + 0x1, &sense->hlen);
		err |= bios_u8(bios, sense->offset + 0x2, &sense->rlen);
		err |= bios_u8(bios, sense->offset + 0x3, &sense->entriesnum);
		sense->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown SENSE table version 0x%x\n", sense->version);
		return -EINVAL;
	};

	err = 0;
	sense->entries = malloc(sense->entriesnum * sizeof(struct envy_bios_power_sense_entry));
	for (i = 0; i < sense->entriesnum; i++) {
		uint32_t data = sense->offset + sense->hlen + i * sense->rlen;

		sense->entries[i].offset = data;

		switch(sense->version) {
		case 0x10:
			err |= bios_u8(bios, data + 0x1, &sense->entries[i].mode);
			err |= bios_u8(bios, data + 0x2, &sense->entries[i].extdev_id);
			if (sense->rlen - 0x3 > 0x10)
				ENVY_BIOS_ERR("SENSE table entry bigger than expected\n");
			for (int j = 0; j < sense->rlen - 0x3 && j < 0x10; ++j)
				err |= bios_u8(bios, data + 0x3 + j, &sense->entries[i].d.raw[j]);
			break;
		case 0x20:
			err |= bios_u8(bios, data + 0x0, &sense->entries[i].mode);
			err |= bios_u8(bios, data + 0x1, &sense->entries[i].extdev_id);
			if (sense->rlen - 0x5 > 0x10)
				ENVY_BIOS_ERR("SENSE table entry bigger than expected\n");
			for (int j = 0; j < sense->rlen - 0x5 && j < 0x10; ++j)
				err |= bios_u8(bios, data + 0x5 + j, &sense->entries[i].d.raw[j]);
			break;
		};
	}

	return 0;
}